

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::Session::Session(Session *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *peVar5;
  char *pcVar6;
  uint32_t uVar7;
  int iVar8;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar11;
  undefined **ppuVar12;
  unique_ptr<Catch::ColourImpl> colourImpl;
  unique_ptr<Catch::IStream> errStream;
  _func_int *local_e0;
  vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_> local_d8;
  Parser local_b0;
  long *local_50;
  SourceLineInfo local_48;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  long *plVar10;
  
  (this->m_cli).super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  ppuVar12 = &PTR__ExeName_001af408;
  (this->m_cli).m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (_func_int **)&PTR__ExeName_001af408;
  local_38 = &(this->m_cli).m_exeName.m_name;
  (this->m_cli).m_exeName.m_name.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  this_00 = &(this->m_cli).m_exeName.m_name.
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,char_const(&)[13]>
            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_38,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_b0,(char (*) [13])"<executable>");
  *(undefined8 *)
   ((long)&(this->m_cli).m_args.
           super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->m_configData).showSuccessfulTests = false;
  (this->m_configData).shouldDebugBreak = false;
  (this->m_configData).noThrow = false;
  (this->m_configData).showHelp = false;
  (this->m_configData).showInvisibles = false;
  (this->m_configData).filenamesAsTags = false;
  (this->m_configData).libIdentify = false;
  (this->m_configData).allowZeroTests = false;
  (this->m_cli).m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cli).m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cli).m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cli).m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cli).m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cli).m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cli).m_exeName.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_cli).m_exeName.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_configData).abortAfter = -1;
  uVar7 = generateRandomSeed(Default);
  (this->m_configData).rngSeed = uVar7;
  (this->m_configData).shardCount = 1;
  (this->m_configData).shardIndex = 0;
  (this->m_configData).skipBenchmarks = false;
  (this->m_configData).benchmarkNoAnalysis = false;
  (this->m_configData).benchmarkSamples = 100;
  (this->m_configData).benchmarkConfidenceInterval = 0.95;
  (this->m_configData).benchmarkResamples = 100000;
  (this->m_configData).benchmarkWarmupTime = 100;
  (this->m_configData).verbosity = Normal;
  (this->m_configData).warnings = Nothing;
  (this->m_configData).showDurations = DefaultForReporter;
  (this->m_configData).minDuration = -1.0;
  (this->m_configData).runOrder = Declared;
  (this->m_configData).defaultColourMode = PlatformDefault;
  (this->m_configData).waitForKeypress = Never;
  (this->m_configData).defaultOutputFilename._M_dataplus._M_p =
       (pointer)&(this->m_configData).defaultOutputFilename.field_2;
  (this->m_configData).defaultOutputFilename._M_string_length = 0;
  (this->m_configData).defaultOutputFilename.field_2._M_local_buf[0] = '\0';
  (this->m_configData).name._M_dataplus._M_p = (pointer)&(this->m_configData).name.field_2;
  (this->m_configData).name._M_string_length = 0;
  (this->m_configData).name.field_2._M_local_buf[0] = '\0';
  (this->m_configData).processName._M_dataplus._M_p =
       (pointer)&(this->m_configData).processName.field_2;
  (this->m_configData).processName._M_string_length = 0;
  (this->m_configData).processName.field_2._M_local_buf[0] = '\0';
  this->m_startupExceptions = false;
  (this->m_configData).sectionsToRun.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_config).m_ptr = (Config *)0x0;
  (this->m_configData).sectionsToRun.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_configData).sectionsToRun.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_configData).testsOrTags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_configData).testsOrTags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_configData).reporterSpecifications.
  super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_configData).testsOrTags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_configData).reporterSpecifications.
  super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_configData).reporterSpecifications.
  super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (Session()::alreadyInstantiated == '\x01') {
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_d8);
    local_48.file =
         "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp"
    ;
    local_48.line = 0x500;
    operator<<((ostream *)
               local_d8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               local_d8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
               _M_impl.super__Vector_impl_data._M_finish,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               local_d8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               "Only one instance of Catch::Session can ever be used",0x34);
    std::__cxx11::stringbuf::str();
    throw_logic_error((string *)&local_b0);
  }
  do {
    pSVar9 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar8 = (*(pSVar9->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[6])(pSVar9);
    plVar10 = (long *)CONCAT44(extraout_var,iVar8);
    if (*plVar10 == plVar10[1]) {
LAB_0013adde:
      Session()::alreadyInstantiated = '\x01';
      makeCommandLineParser(&local_b0,&this->m_configData);
      _Var4._M_pi = local_b0.m_exeName.m_name.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar3 = local_b0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_b0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_b0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var2 = this_00->_M_pi;
      (local_38->
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = peVar3;
      (local_38->
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = _Var4._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      _Var4._M_pi = local_b0.m_exeName.m_ref.
                    super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar5 = local_b0.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_b0.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      local_b0.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var2 = (this->m_cli).m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (this->m_cli).m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = peVar5;
      (this->m_cli).m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var4._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      local_d8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(this->m_cli).m_options.
                    super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      local_d8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(this->m_cli).m_options.
                    super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
      local_d8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(this->m_cli).m_options.
                    super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->m_cli).m_options.
      super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_b0.m_options.
           super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
           super__Vector_impl_data._M_start;
      (this->m_cli).m_options.
      super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_b0.m_options.
           super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (this->m_cli).m_options.
      super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_b0.m_options.
           super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_b0.m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b0.m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b0.m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector
                ((vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_> *)&local_d8);
      local_d8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
      super__Vector_impl_data._M_start =
           (this->m_cli).m_args.
           super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_d8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (this->m_cli).m_args.
           super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_d8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (this->m_cli).m_args.
           super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (this->m_cli).m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_b0.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (this->m_cli).m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_b0.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (this->m_cli).m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_b0.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_b0.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b0.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b0.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_d8);
      local_b0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
      std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_b0.m_args);
      std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector
                (&local_b0.m_options);
      local_b0.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
      _vptr_ParserBase = (ParserBase)(ParserBase)ppuVar12;
      if (local_b0.m_exeName.m_ref.
          super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.m_exeName.m_ref.
                   super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_b0.m_exeName.m_name.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.m_exeName.m_name.
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return;
    }
    config(this);
    if (Context::currentContext == (undefined8 *)0x0) {
      Context::currentContext = (undefined8 *)operator_new(0x10);
      *Context::currentContext = 0;
      Context::currentContext[1] = 0;
    }
    *Context::currentContext = (this->m_config).m_ptr;
    this->m_startupExceptions = true;
    psVar1 = &local_b0.m_exeName.m_name;
    local_b0.super_ParserBase._vptr_ParserBase = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"%stderr","");
    makeStream((Catch *)&local_48,(string *)&local_b0);
    if ((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_b0.super_ParserBase._vptr_ParserBase != psVar1) {
      operator_delete(local_b0.super_ParserBase._vptr_ParserBase,
                      (ulong)((long)&((local_b0.m_exeName.m_name.
                                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->_M_dataplus)._M_p + 1));
    }
    pcVar6 = local_48.file;
    makeColourImpl((Catch *)&local_50,PlatformDefault,(IStream *)local_48.file);
    iVar8 = (*(*(_func_int ***)pcVar6)[2])(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)CONCAT44(extraout_var_00,iVar8),"Errors occurred during startup!",0x1f);
    local_b0.super_ParserBase._vptr_ParserBase._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)CONCAT44(extraout_var_00,iVar8),(char *)&local_b0,1);
    ppuVar12 = (undefined **)*plVar10;
    if ((_func_int **)ppuVar12 == (_func_int **)plVar10[1]) {
      if (local_50 != (long *)0x0) {
        (**(code **)(*local_50 + 8))();
      }
      ppuVar12 = &PTR__ExeName_001af408;
      if ((IStream *)local_48.file != (IStream *)0x0) {
        (*(*(_func_int ***)local_48.file)[1])();
      }
      goto LAB_0013adde;
    }
    local_e0 = (_func_int *)*ppuVar12;
    if (local_e0 != (_func_int *)0x0) {
      std::__exception_ptr::exception_ptr::_M_addref();
    }
    uVar11 = std::rethrow_exception((exception_ptr)&local_e0);
    if ((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_b0.super_ParserBase._vptr_ParserBase != &local_b0.m_exeName.m_name) {
      operator_delete(local_b0.super_ParserBase._vptr_ParserBase,
                      (ulong)((long)&((local_b0.m_exeName.m_name.
                                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->_M_dataplus)._M_p + 1));
    }
    ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_d8);
    __cxa_begin_catch(uVar11);
    pSVar9 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    (*(pSVar9->super_RegistryHub).super_IMutableRegistryHub._vptr_IMutableRegistryHub[7])
              (&(pSVar9->super_RegistryHub).super_IMutableRegistryHub);
    __cxa_end_catch();
  } while( true );
}

Assistant:

Session::Session() {
        static bool alreadyInstantiated = false;
        if( alreadyInstantiated ) {
            CATCH_TRY { CATCH_INTERNAL_ERROR( "Only one instance of Catch::Session can ever be used" ); }
            CATCH_CATCH_ALL { getMutableRegistryHub().registerStartupException(); }